

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O2

int16 get16bits11signed(int base,int table,int mul,int index)

{
  int iVar1;
  uint uVar2;
  short sVar3;
  short sVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  uVar5 = -alphaBase[table][3 - index % 4];
  if ((index & 0xfffffffcU) == 4) {
    uVar5 = ~alphaBase[table][3 - index % 4];
  }
  iVar7 = 1;
  if (mul != 0) {
    iVar7 = mul * 8;
  }
  iVar1 = -(iVar7 * uVar5);
  if ((index & 0xfffffffcU) == 4) {
    iVar1 = iVar7 * uVar5;
  }
  iVar7 = -0x3f8;
  if (base != 0) {
    iVar7 = base * 8 + -0x400;
  }
  uVar6 = iVar7 + iVar1;
  uVar5 = 0xfffffc01;
  if (-0x3ff < (int)uVar6) {
    uVar5 = uVar6;
  }
  if (0x3fe < (int)uVar5) {
    uVar5 = 0x3ff;
  }
  uVar2 = -uVar5;
  if (0 < (int)uVar5) {
    uVar2 = uVar5;
  }
  sVar3 = (short)(uVar2 >> 5) + (short)uVar2 * 0x20;
  sVar4 = -sVar3;
  if (-1 < (int)uVar6) {
    sVar4 = sVar3;
  }
  return sVar4;
}

Assistant:

int16 get16bits11signed(int base, int table, int mul, int index) 
{
	int elevenbase = base-128;
	if(elevenbase==-128)
		elevenbase=-127;
	elevenbase*=8;
	//i want the positive value here
	int tabVal = -alphaBase[table][3-index%4]-1;
	//and the sign, please
	int sign = 1-(index/4);
	
	if(sign)
		tabVal=tabVal+1;
	int elevenTabVal = tabVal*8;

	if(mul!=0)
		elevenTabVal*=mul;
	else
		elevenTabVal/=8;

	if(sign)
		elevenTabVal=-elevenTabVal;

	//calculate sum
	int elevenbits = elevenbase+elevenTabVal;

	//clamp..
	if(elevenbits>=1024)
		elevenbits=1023;
	else if(elevenbits<-1023)
		elevenbits=-1023;
	//this is the value we would actually output.. 
	//but there aren't any good 11-bit file or uncompressed GL formats
	//so we extend to 15 bits signed.
	sign = elevenbits<0;
	elevenbits=abs(elevenbits);
	int16 fifteenbits = (elevenbits<<5)+(elevenbits>>5);
	int16 sixteenbits=fifteenbits;

	if(sign)
		sixteenbits=-sixteenbits;
	
	return sixteenbits;
}